

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O1

void get_str(char **pt,char *kvalue,unsigned_long *stat)

{
  ushort *puVar1;
  uint uVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char cVar5;
  char cVar6;
  size_t __n;
  char *pcVar7;
  char *__src;
  bool bVar8;
  
  cVar6 = (*pt)[1];
  __src = *pt + 1;
  pcVar4 = __src;
  if (cVar6 != '\0') {
    ppuVar3 = __ctype_b_loc();
    puVar1 = *ppuVar3;
    cVar5 = 'a';
    do {
      if ((*(byte *)((long)puVar1 + (long)cVar6 * 2 + 1) & 0x40) == 0) {
        *(byte *)stat = (byte)*stat | 1;
      }
      bVar8 = cVar5 == '\'';
      cVar5 = *pcVar4;
      if ((bVar8) && (bVar8 = cVar5 != '\'', cVar5 = 'a', bVar8)) break;
      cVar6 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
    } while (cVar6 != '\0');
  }
  pcVar7 = pcVar4 + -1;
  if (pcVar4[-1] != '\'') {
    *(byte *)stat = (byte)*stat | 2;
  }
  uVar2 = (int)pcVar7 - (int)__src;
  __n = 0;
  if (0 < (int)uVar2) {
    __n = (size_t)uVar2;
  }
  strncpy(kvalue,__src,__n);
  pcVar4 = kvalue + __n + -1;
  kvalue[__n] = '\0';
  if (kvalue <= pcVar4) {
    ppuVar3 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar3 + (long)*pcVar4 * 2 + 1) & 0x20) == 0) break;
      *pcVar4 = '\0';
      pcVar4 = pcVar4 + -1;
    } while (kvalue <= pcVar4);
  }
  ppuVar3 = __ctype_b_loc();
  do {
    pcVar4 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
    if ((long)*pcVar4 == 0) break;
  } while (((*ppuVar3)[*pcVar4] & 0x2000) != 0);
  *pt = pcVar7;
  return;
}

Assistant:

void get_str(char **pt,     		/* card string from character 11*/
	    char *kvalue,		/* key value string */
	    unsigned long *stat		/* error number */
	   )
{    
    char *pi;
    char prev;		/* previous char */
    int nchar = 0;
    char *p;
  
    p = *pt;
    pi = p;
    p++;
    prev = 'a';
    while(*p != '\0') { 
        if( !isprint((int)*p) )*stat |= BAD_STR;
	if(prev == '\'' && *p != '\'') break;
	if(prev == '\'' && *p == '\'') {    /* skip the '' */
	    p++;
	    prev = 'a';
        } 
	else {
            prev = *p;
            p++;
        }
    }
    p--;
    if(*p != '\'') *stat |= NO_TRAIL_QUOTE; 
    pi++;	    
    nchar = p - pi ;     /* excluding the ' */
    if (nchar < 0) nchar = 0; 
    strncpy(kvalue,pi,(size_t)nchar);
    *(kvalue+nchar) = '\0'; 
    pi = kvalue + (nchar -1) ; 
    while(pi >= kvalue && isspace((int)*pi)){ *pi = '\0'; pi--;} /* delete the trailing space */ 
    p++;				  /* skip the  ' */
    while(isspace((int)*p) && *p != '\0')  p++; 
    *pt = p;
    return;
}